

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_70a26::PedestrianPlugIn::drawPathAndObstacles(PedestrianPlugIn *this)

{
  int iVar1;
  PolylineSegmentedPathwaySingleRadius *pPVar2;
  undefined4 extraout_var;
  size_type i;
  PolylineSegmentedPathwaySingleRadius *path;
  Vec3 *in_stack_ffffffffffffff98;
  Vec3 *startPoint;
  Vec3 *local_18;
  
  pPVar2 = getTestPath();
  local_18 = (Vec3 *)0x1;
  while( true ) {
    startPoint = local_18;
    iVar1 = (*(pPVar2->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])();
    if ((Vec3 *)CONCAT44(extraout_var,iVar1) <= startPoint) break;
    (*(pPVar2->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pPVar2,local_18);
    (*(pPVar2->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
              (pPVar2,(undefined1 *)((long)&local_18[-1].z + 3));
    OpenSteer::drawLine(startPoint,in_stack_ffffffffffffff98,(Color *)0x1551ed);
    local_18 = (Vec3 *)((long)&local_18->x + 1);
  }
  return;
}

Assistant:

void drawPathAndObstacles (void)
        {
            typedef PolylineSegmentedPathwaySingleRadius::size_type size_type;
            
            // draw a line along each segment of path
            const PolylineSegmentedPathwaySingleRadius& path = *getTestPath ();
            for (size_type i = 1; i < path.pointCount(); ++i ) {
                drawLine (path.point( i ), path.point( i-1) , gRed);
            }
            
            // draw obstacles
            drawXZCircle (gObstacle1.radius, gObstacle1.center, gWhite, 40);
            drawXZCircle (gObstacle2.radius, gObstacle2.center, gWhite, 40);
    // ------------------------------------ xxxcwr11-1-04 fixing steerToAvoid
            {
                float w = gObstacle3.width * 0.5f;
                Vec3 p = gObstacle3.position ();
                Vec3 s = gObstacle3.side ();
                drawLine (p + (s * w), p + (s * -w), gWhite);

                Vec3 v1 = gObstacle3.globalizePosition (Vec3 (w, w, 0));
                Vec3 v2 = gObstacle3.globalizePosition (Vec3 (-w, w, 0));
                Vec3 v3 = gObstacle3.globalizePosition (Vec3 (-w, -w, 0));
                Vec3 v4 = gObstacle3.globalizePosition (Vec3 (w, -w, 0));

                drawLine (v1, v2, gWhite);
                drawLine (v2, v3, gWhite);
                drawLine (v3, v4, gWhite);
                drawLine (v4, v1, gWhite);
            }
    // ------------------------------------ xxxcwr11-1-04 fixing steerToAvoid
        }